

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON_Utils.c
# Opt level: O0

cJSON * get_item_from_pointer(cJSON *object,char *pointer,cJSON_bool case_sensitive)

{
  int iVar1;
  cJSON_bool cVar2;
  long in_FS_OFFSET;
  bool bVar3;
  cJSON *local_40;
  cJSON *current_element;
  uchar *puStack_30;
  cJSON_bool case_sensitive_local;
  char *pointer_local;
  cJSON *object_local;
  size_t local_18;
  size_t index;
  
  index = *(size_t *)(in_FS_OFFSET + 0x28);
  local_40 = object;
  puStack_30 = (uchar *)pointer;
  if (pointer == (char *)0x0) {
    object_local = (cJSON *)0x0;
  }
  else {
    while (*puStack_30 == '/' && local_40 != (cJSON *)0x0) {
      puStack_30 = puStack_30 + 1;
      iVar1 = cJSON_IsArray(local_40);
      if (iVar1 == 0) {
        iVar1 = cJSON_IsObject(local_40);
        if (iVar1 == 0) {
          object_local = (cJSON *)0x0;
          goto LAB_001017ca;
        }
        local_40 = local_40->child;
        while( true ) {
          bVar3 = false;
          if (local_40 != (cJSON *)0x0) {
            cVar2 = compare_pointers((uchar *)local_40->string,puStack_30,case_sensitive);
            bVar3 = cVar2 == 0;
          }
          if (!bVar3) break;
          local_40 = local_40->next;
        }
      }
      else {
        local_18 = 0;
        cVar2 = decode_array_index_from_pointer(puStack_30,&local_18);
        if (cVar2 == 0) {
          object_local = (cJSON *)0x0;
          goto LAB_001017ca;
        }
        local_40 = get_array_item(local_40,local_18);
      }
      while( true ) {
        bVar3 = false;
        if (*puStack_30 != '\0') {
          bVar3 = *puStack_30 != '/';
        }
        if (!bVar3) break;
        puStack_30 = puStack_30 + 1;
      }
    }
    object_local = local_40;
  }
LAB_001017ca:
  if (*(size_t *)(in_FS_OFFSET + 0x28) == index) {
    return object_local;
  }
  __stack_chk_fail();
}

Assistant:

static cJSON *get_item_from_pointer(cJSON * const object, const char * pointer, const cJSON_bool case_sensitive)
{
    cJSON *current_element = object;

    if (pointer == NULL)
    {
        return NULL;
    }

    /* follow path of the pointer */
    while ((pointer[0] == '/') && (current_element != NULL))
    {
        pointer++;
        if (cJSON_IsArray(current_element))
        {
            size_t index = 0;
            if (!decode_array_index_from_pointer((const unsigned char*)pointer, &index))
            {
                return NULL;
            }

            current_element = get_array_item(current_element, index);
        }
        else if (cJSON_IsObject(current_element))
        {
            current_element = current_element->child;
            /* GetObjectItem. */
            while ((current_element != NULL) && !compare_pointers((unsigned char*)current_element->string, (const unsigned char*)pointer, case_sensitive))
            {
                current_element = current_element->next;
            }
        }
        else
        {
            return NULL;
        }

        /* skip to the next path token or end of string */
        while ((pointer[0] != '\0') && (pointer[0] != '/'))
        {
            pointer++;
        }
    }

    return current_element;
}